

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomReporter.cpp
# Opt level: O1

shared_ptr<ApprovalTests::GenericDiffReporter> __thiscall
ApprovalTests::CustomReporter::create(CustomReporter *this,string *path,string *arguments,Type type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<ApprovalTests::GenericDiffReporter> sVar3;
  DiffInfo info;
  undefined1 local_a1;
  string local_a0;
  string local_80;
  DiffInfo local_60;
  
  local_a0._M_dataplus._M_p = (path->_M_dataplus)._M_p;
  paVar1 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == paVar1) {
    local_a0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_a0.field_2._8_8_ = *(undefined8 *)((long)&path->field_2 + 8);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_a0._M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar1;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (arguments->_M_dataplus)._M_p;
  paVar1 = &arguments->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == paVar1) {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&arguments->field_2 + 8);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_80._M_string_length = arguments->_M_string_length;
  (arguments->_M_dataplus)._M_p = (pointer)paVar1;
  arguments->_M_string_length = 0;
  (arguments->field_2)._M_local_buf[0] = '\0';
  DiffInfo::DiffInfo(&local_60,&local_a0,&local_80,type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  *(undefined8 *)this = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ApprovalTests::GenericDiffReporter,std::allocator<ApprovalTests::GenericDiffReporter>,ApprovalTests::DiffInfo&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(GenericDiffReporter **)this,
             (allocator<ApprovalTests::GenericDiffReporter> *)&local_a1,&local_60);
  _Var2._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.arguments._M_dataplus._M_p != &local_60.arguments.field_2) {
    operator_delete(local_60.arguments._M_dataplus._M_p);
    _Var2._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.program._M_dataplus._M_p != &local_60.program.field_2) {
    operator_delete(local_60.program._M_dataplus._M_p);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ApprovalTests::GenericDiffReporter>)
         sVar3.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenericDiffReporter>
    CustomReporter::create(std::string path, std::string arguments, Type type)
    {
        DiffInfo info(std::move(path), std::move(arguments), type);
        return std::make_shared<GenericDiffReporter>(info);
    }